

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O0

int run_test_stdio_over_pipes(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_b8 [8];
  uv_stdio_container_t stdio [2];
  uv_process_t process;
  int r;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  init_process_options("stdio_over_pipes_helper",exit_cb);
  uv_pipe_init(::loop,&out,0);
  uv_pipe_init(::loop,&in,0);
  options.stdio = (uv_stdio_container_t *)local_b8;
  local_b8._0_4_ = UV_READABLE_PIPE|UV_CREATE_PIPE;
  stdio[0]._0_8_ = &in;
  stdio[0].data.fd = 0x21;
  stdio[1]._0_8_ = &out;
  options.stdio_count = 2;
  iVar1 = uv_spawn(::loop,&stdio[1].data,&options);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x8b,"r == 0");
    abort();
  }
  iVar1 = uv_read_start(&out,on_alloc,on_read);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x8e,"r == 0");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x91,"r == 0");
    abort();
  }
  if (on_read_cb_called < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x93,"on_read_cb_called > 1");
    abort();
  }
  if (after_write_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x94,"after_write_cb_called == 1");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x95,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x96,"close_cb_called == 3");
    abort();
  }
  iVar1 = memcmp("hello world\n",output,0xc);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x97,"memcmp(\"hello world\\n\", output, 12) == 0");
    abort();
  }
  if (output_used != 0xc) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x98,"output_used == 12");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0x9a,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(stdio_over_pipes) {
  int r;
  uv_process_t process;
  uv_stdio_container_t stdio[2];

  loop = uv_default_loop();

  init_process_options("stdio_over_pipes_helper", exit_cb);

  uv_pipe_init(loop, &out, 0);
  uv_pipe_init(loop, &in, 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*)&in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*)&out;
  options.stdio_count = 2;

  r = uv_spawn(loop, &process, &options);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(on_read_cb_called > 1);
  ASSERT(after_write_cb_called == 1);
  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);
  ASSERT(memcmp("hello world\n", output, 12) == 0);
  ASSERT(output_used == 12);

  MAKE_VALGRIND_HAPPY();
  return 0;
}